

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

void __thiscall gnuplotio::PlotData::PlotData(PlotData *this,string *_plotspec)

{
  std::__cxx11::string::string((string *)this,(string *)_plotspec);
  this->is_text = true;
  this->is_inline = false;
  this->has_data = false;
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  (this->data)._M_string_length = 0;
  (this->data).field_2._M_local_buf[0] = '\0';
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  (this->arr_or_rec)._M_dataplus._M_p = (pointer)&(this->arr_or_rec).field_2;
  (this->arr_or_rec)._M_string_length = 0;
  (this->arr_or_rec).field_2._M_local_buf[0] = '\0';
  (this->bin_fmt)._M_dataplus._M_p = (pointer)&(this->bin_fmt).field_2;
  (this->bin_fmt)._M_string_length = 0;
  (this->bin_fmt).field_2._M_local_buf[0] = '\0';
  (this->bin_size)._M_dataplus._M_p = (pointer)&(this->bin_size).field_2;
  (this->bin_size)._M_string_length = 0;
  (this->bin_size).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit PlotData(const std::string &_plotspec) :
        plotspec(_plotspec),
        is_text(true),
        is_inline(false),
        has_data(false)
    { }